

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<unsigned_long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,unsigned_long_long *v,
               unsigned_long_long v_min,unsigned_long_long v_max,char *format,ImGuiSliderFlags flags
               ,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  undefined1 auVar2 [12];
  bool bVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  int iVar6;
  ImGuiContext *g;
  float *pfVar7;
  unsigned_long_long uVar8;
  uint uVar9;
  bool bVar10;
  ulong idx;
  undefined1 is_logarithmic;
  long lVar11;
  ulong v_max_00;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float logarithmic_zero_epsilon;
  float fVar17;
  float t;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  float zero_deadzone_halfsize;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float old_clicked_t;
  undefined1 extraout_var [56];
  
  pIVar4 = GImGui;
  is_logarithmic = (undefined1)v_max;
  lVar11 = v_min - v_max;
  if (v_min < v_max) {
    lVar11 = -(v_min - v_max);
  }
  uVar5 = flags & 0x100000;
  idx = (ulong)(uVar5 >> 0x14);
  uVar9 = data_type & 0xfffffffe;
  bVar10 = (bool)((byte)((flags & 0x20U) >> 5) & uVar9 == 8);
  fVar12 = ImVec2::operator[](&bb->Max,idx);
  fVar13 = ImVec2::operator[](&bb->Min,idx);
  fVar13 = (fVar12 - fVar13) + -4.0;
  fVar12 = (pIVar4->Style).GrabMinSize;
  auVar20 = ZEXT416((uint)fVar12);
  if (-1 < lVar11 && uVar9 != 8) {
    auVar22 = ZEXT416((uint)(fVar13 / (float)(lVar11 + 1)));
    auVar20 = vcmpss_avx(ZEXT416((uint)fVar12),auVar22,2);
    auVar20 = vblendvps_avx(ZEXT416((uint)fVar12),auVar22,auVar20);
  }
  auVar20 = vminss_avx(auVar20,ZEXT416((uint)fVar13));
  fVar14 = auVar20._0_4_;
  fVar12 = fVar13 - fVar14;
  fVar15 = ImVec2::operator[](&bb->Min,idx);
  fVar16 = ImVec2::operator[](&bb->Max,idx);
  zero_deadzone_halfsize = 0.0;
  logarithmic_zero_epsilon = 0.0;
  if (bVar10 != false) {
    iVar6 = ImParseFormatPrecision(format,3);
    logarithmic_zero_epsilon = powf(0.1,(float)iVar6);
    auVar20 = vmaxss_avx(ZEXT416((uint)fVar12),ZEXT416(0x3f800000));
    zero_deadzone_halfsize = ((pIVar4->Style).LogSliderDeadzone * 0.5) / auVar20._0_4_;
  }
  fVar15 = fVar15 + 2.0 + fVar14 * 0.5;
  v_max_00 = (ulong)bVar10;
  if (pIVar4->ActiveId == id) {
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar4->ActiveIdIsJustActivated == true) {
        pIVar4->SliderCurrentAccum = 0.0;
        pIVar4->SliderCurrentAccumDirty = false;
      }
      auVar23._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      auVar23._8_56_ = extraout_var;
      auVar20 = auVar23._0_16_;
      if (uVar5 != 0) {
        auVar22 = vmovshdup_avx(auVar20);
        auVar20._0_8_ = auVar22._0_8_ ^ 0x8000000080000000;
        auVar20._8_4_ = auVar22._8_4_ ^ 0x80000000;
        auVar20._12_4_ = auVar22._12_4_ ^ 0x80000000;
      }
      fVar12 = auVar20._0_4_;
      if ((fVar12 != 0.0) || (NAN(fVar12))) {
        auVar2 = auVar20._4_12_;
        if ((uVar9 == 8) && (iVar6 = ImParseFormatPrecision(format,3), 0 < iVar6)) {
          auVar21._0_4_ = fVar12 / 100.0;
          auVar21._4_12_ = auVar2;
          auVar24._0_4_ = auVar21._0_4_ / 10.0;
          auVar24._4_12_ = auVar2;
          auVar20 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xe]),1);
          auVar22 = vblendvps_avx(auVar21,auVar24,auVar20);
        }
        else if ((lVar11 + 100U < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          auVar20 = vcmpss_avx(auVar20,ZEXT816(0) << 0x40,1);
          auVar25._8_4_ = 0xbf800000;
          auVar25._0_8_ = 0xbf800000bf800000;
          auVar25._12_4_ = 0xbf800000;
          auVar26._8_4_ = 0x3f800000;
          auVar26._0_8_ = 0x3f8000003f800000;
          auVar26._12_4_ = 0x3f800000;
          auVar20 = vblendvps_avx(auVar26,auVar25,auVar20);
          auVar22._0_4_ = auVar20._0_4_ / (float)lVar11;
          auVar22._4_12_ = auVar20._4_12_;
        }
        else {
          auVar22._0_4_ = fVar12 / 100.0;
          auVar22._4_12_ = auVar2;
        }
        auVar20 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xf]),1);
        auVar20 = vblendvps_avx(auVar22,ZEXT416((uint)(auVar22._0_4_ * 10.0)),auVar20);
        fVar12 = auVar20._0_4_ + pIVar4->SliderCurrentAccum;
        pIVar4->SliderCurrentAccum = fVar12;
        pIVar4->SliderCurrentAccumDirty = true;
      }
      else {
        fVar12 = pIVar4->SliderCurrentAccum;
      }
      if ((pIVar4->NavActivatePressedId == id) && (pIVar4->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if (pIVar4->SliderCurrentAccumDirty == true) {
        fVar17 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                           ((ImGui *)(ulong)(uint)data_type,(ImGuiDataType)*v,v_min,v_max,v_max_00,
                            (bool)is_logarithmic,logarithmic_zero_epsilon,zero_deadzone_halfsize);
        if (((fVar17 < 1.0) || (fVar12 <= 0.0)) && ((0.0 < fVar17 || (0.0 <= fVar12)))) {
          auVar22 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar12 + fVar17)));
          auVar20 = vcmpss_avx(ZEXT416((uint)(fVar12 + fVar17)),ZEXT816(0) << 0x40,1);
          auVar20 = vandnps_avx(auVar20,auVar22);
          t = auVar20._0_4_;
          uVar8 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                            (data_type,t,v_min,v_max,bVar10,logarithmic_zero_epsilon,
                             zero_deadzone_halfsize);
          if ((flags & 0x40U) == 0) {
            uVar8 = RoundScalarWithFormatT<unsigned_long_long,long_long>(format,data_type,uVar8);
          }
          fVar18 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                             ((ImGui *)(ulong)(uint)data_type,(ImGuiDataType)uVar8,v_min,v_max,
                              v_max_00,(bool)is_logarithmic,logarithmic_zero_epsilon,
                              zero_deadzone_halfsize);
          fVar18 = fVar18 - fVar17;
          bVar3 = fVar12 <= fVar18;
          if (0.0 < fVar12) {
            bVar3 = fVar18 < fVar12;
          }
          if (!bVar3) {
            fVar18 = fVar12;
          }
          pIVar4->SliderCurrentAccum = pIVar4->SliderCurrentAccum - fVar18;
          pIVar4->SliderCurrentAccumDirty = false;
          goto LAB_001733c0;
        }
        pIVar4->SliderCurrentAccum = 0.0;
        pIVar4->SliderCurrentAccumDirty = false;
      }
    }
    else {
      if (pIVar4->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_0017341e;
      if ((pIVar4->IO).MouseDown[0] != false) {
        pfVar7 = ImVec2::operator[](&(pIVar4->IO).MousePos,idx);
        t = 0.0;
        if (0.0 < fVar12) {
          auVar19._0_4_ = (*pfVar7 - fVar15) / fVar12;
          auVar19._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar22 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar19);
          auVar20 = vcmpss_avx(auVar19,ZEXT816(0) << 0x40,1);
          auVar20 = vandnps_avx(auVar20,auVar22);
          t = auVar20._0_4_;
        }
        if (uVar5 != 0) {
          t = 1.0 - t;
        }
LAB_001733c0:
        uVar8 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                          (data_type,t,v_min,v_max,bVar10,logarithmic_zero_epsilon,
                           zero_deadzone_halfsize);
        if ((flags & 0x40U) == 0) {
          uVar8 = RoundScalarWithFormatT<unsigned_long_long,long_long>(format,data_type,uVar8);
        }
        if (*v == uVar8) {
          bVar10 = false;
        }
        else {
          *v = uVar8;
          bVar10 = true;
        }
        goto LAB_0017365d;
      }
      ClearActiveID();
    }
    bVar10 = false;
  }
  else {
LAB_0017341e:
    bVar10 = false;
  }
LAB_0017365d:
  if (1.0 <= fVar13) {
    fVar12 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                       ((ImGui *)(ulong)(uint)data_type,(ImGuiDataType)*v,v_min,v_max,v_max_00,
                        (bool)is_logarithmic,logarithmic_zero_epsilon,zero_deadzone_halfsize);
    if (uVar5 != 0) {
      fVar12 = 1.0 - fVar12;
    }
    fVar15 = (((fVar16 + -2.0) - fVar14 * 0.5) - fVar15) * fVar12 + fVar15;
    if (uVar5 != 0) {
      fVar12 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar14 * 0.5 + fVar15;
      (out_grab_bb->Max).x = fVar12 + -2.0;
      (out_grab_bb->Max).y = fVar14 * 0.5 + fVar15;
    }
    else {
      fVar12 = (bb->Min).y;
      fVar13 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar14 * 0.5 + fVar15;
      (out_grab_bb->Min).y = fVar12 + 2.0;
      (out_grab_bb->Max).x = fVar14 * 0.5 + fVar15;
      (out_grab_bb->Max).y = fVar13 + -2.0;
    }
  }
  else {
    IVar1 = bb->Min;
    out_grab_bb->Min = IVar1;
    out_grab_bb->Max = IVar1;
  }
  return bVar10;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}